

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

void GD::learn<false,true,false,false,true,0ul,0ul,0ul>(gd *g,base_learner *base,example *ec)

{
  (*g->predict)(g,base,ec);
  update<false,true,false,false,true,0ul,0ul,0ul>(g,base,ec);
  return;
}

Assistant:

void learn(gd& g, base_learner& base, example& ec)
{
  // invariant: not a test label, importance weight > 0
  assert(ec.in_use);
  assert(ec.l.simple.label != FLT_MAX);
  assert(ec.weight > 0.);
  g.predict(g, base, ec);
  update<sparse_l2, invariant, sqrt_rate, feature_mask_off, adax, adaptive, normalized, spare>(g, base, ec);
}